

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

ModuleRunner * __thiscall
wasm::ShellExternalInterface::getImportInstance(ShellExternalInterface *this,Importable *import)

{
  bool bVar1;
  Fatal *pFVar2;
  pointer ppVar3;
  element_type *peVar4;
  Fatal local_1b0;
  _Self local_28;
  _Self local_20;
  iterator it;
  Importable *import_local;
  ShellExternalInterface *this_local;
  
  it._M_node = (_Base_ptr)import;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
       ::find(&this->linkedInstances,&import->module);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
       ::end(&this->linkedInstances);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>::
             operator->(&local_20);
    peVar4 = std::__shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(ppVar3->second).
                         super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>);
    return peVar4;
  }
  Fatal::Fatal(&local_1b0);
  pFVar2 = Fatal::operator<<(&local_1b0,(char (*) [32])"importGlobals: unknown import: ");
  pFVar2 = Fatal::operator<<(pFVar2,(basic_string_view<char,_std::char_traits<char>_> *)
                                    &(it._M_node)->_M_right);
  pFVar2 = Fatal::operator<<(pFVar2,(char (*) [2])0x39dbd3);
  Fatal::operator<<(pFVar2,(basic_string_view<char,_std::char_traits<char>_> *)
                           &it._M_node[1]._M_parent);
  Fatal::~Fatal(&local_1b0);
}

Assistant:

ModuleRunner* getImportInstance(Importable* import) {
    auto it = linkedInstances.find(import->module);
    if (it == linkedInstances.end()) {
      Fatal() << "importGlobals: unknown import: " << import->module.str << "."
              << import->base.str;
    }
    return it->second.get();
  }